

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::Viterbi
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *status)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  int x_1;
  size_t preY;
  size_t y_1;
  size_t x;
  double emitProb;
  size_t y;
  vector<double,_std::allocator<double>_> weight;
  vector<int,_std::allocator<int>_> path;
  double endS;
  double endE;
  double tmp;
  size_t stat;
  size_t old;
  size_t now;
  size_t XYSize;
  size_t X;
  size_t Y;
  double in_stack_fffffffffffffea0;
  value_type vVar6;
  HMMModel *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  value_type in_stack_fffffffffffffeb4;
  HMMModel *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  int local_e4;
  ulong local_e0;
  size_type local_d8;
  ulong local_d0;
  size_type local_c0;
  vector<double,_std::allocator<double>_> local_b0 [2];
  vector<int,_std::allocator<int>_> local_80;
  double local_68;
  double local_60;
  HMMModel *local_58;
  value_type local_50;
  size_type local_48;
  size_type local_40;
  long local_38;
  ulong local_30;
  ulong local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  
  local_28 = 4;
  local_38 = in_RDX - in_RSI >> 2;
  local_30 = local_38 * -0x3333333333333333;
  local_38 = local_38 * 0x3333333333333334;
  local_20 = in_RCX;
  std::allocator<int>::allocator((allocator<int> *)0x155a08);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             (size_type)in_stack_fffffffffffffeb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::allocator<int>::~allocator((allocator<int> *)0x155a2e);
  std::allocator<double>::allocator((allocator<double> *)0x155a4d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::allocator<double>::~allocator((allocator<double> *)0x155a73);
  for (local_c0 = 0; local_c0 < local_28; local_c0 = local_c0 + 1) {
    dVar5 = *(double *)(*(long *)(in_RDI + 0x40) + 8 + local_c0 * 8);
    std::
    vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
    ::operator[]((vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                  *)(*(long *)(in_RDI + 0x40) + 0x188),local_c0);
    dVar4 = HMMModel::GetEmitProb
                      (in_stack_fffffffffffffeb8,
                       (EmitProbMap *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (Rune)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_c0 * local_30);
    *pvVar1 = dVar5 + dVar4;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_c0 * local_30);
    *pvVar2 = -1;
  }
  for (local_d0 = 1; local_d0 < local_30; local_d0 = local_d0 + 1) {
    for (local_d8 = 0; local_d8 < local_28; local_d8 = local_d8 + 1) {
      local_40 = local_d0 + local_d8 * local_30;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_40);
      *pvVar1 = -3.14e+100;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_40);
      *pvVar2 = 1;
      in_stack_fffffffffffffec0 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x40);
      std::
      vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
      ::operator[]((vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                    *)&in_stack_fffffffffffffec0[0x10].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,local_d8);
      dVar5 = HMMModel::GetEmitProb
                        (in_stack_fffffffffffffeb8,
                         (EmitProbMap *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (Rune)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0)
      ;
      for (local_e0 = 0; local_e0 < local_28; local_e0 = local_e0 + 1) {
        local_48 = (local_d0 - 1) + local_e0 * local_30;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_48);
        in_stack_fffffffffffffeb8 =
             (HMMModel *)
             (*pvVar1 + *(double *)
                         (*(long *)(in_RDI + 0x40) + 0x28 + local_e0 * 0x20 + local_d8 * 8) + dVar5)
        ;
        local_58 = in_stack_fffffffffffffeb8;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_40);
        if (*pvVar1 <= (double)in_stack_fffffffffffffeb8 &&
            (double)in_stack_fffffffffffffeb8 != *pvVar1) {
          in_stack_fffffffffffffea8 = local_58;
          pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_40);
          *pvVar1 = (value_type)in_stack_fffffffffffffea8;
          in_stack_fffffffffffffeb4 = (value_type)local_e0;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_40);
          *pvVar2 = in_stack_fffffffffffffeb4;
        }
      }
    }
  }
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_30 * 2 - 1);
  local_60 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,local_30 * 4 - 1);
  local_68 = *pvVar1;
  if (local_60 < local_68) {
    local_50 = 3;
  }
  else {
    local_50 = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0,
             (size_type)in_stack_fffffffffffffeb8);
  local_e4 = (int)local_30;
  while (local_e4 = local_e4 + -1, -1 < local_e4) {
    vVar6 = local_50;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_20,(long)local_e4);
    *pvVar3 = vVar6;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&local_80,(long)local_e4 + local_50 * local_30);
    local_50 = (value_type)*pvVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void Viterbi(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<size_t>& status) const {
    size_t Y = HMMModel::STATUS_SUM;
    size_t X = end - begin;

    size_t XYSize = X * Y;
    size_t now, old, stat;
    double tmp, endE, endS;

    vector<int> path(XYSize);
    vector<double> weight(XYSize);

    //start
    for (size_t y = 0; y < Y; y++) {
      weight[0 + y * X] = model_->startProb[y] + model_->GetEmitProb(model_->emitProbVec[y], begin->rune, MIN_DOUBLE);
      path[0 + y * X] = -1;
    }

    double emitProb;

    for (size_t x = 1; x < X; x++) {
      for (size_t y = 0; y < Y; y++) {
        now = x + y*X;
        weight[now] = MIN_DOUBLE;
        path[now] = HMMModel::E; // warning
        emitProb = model_->GetEmitProb(model_->emitProbVec[y], (begin+x)->rune, MIN_DOUBLE);
        for (size_t preY = 0; preY < Y; preY++) {
          old = x - 1 + preY * X;
          tmp = weight[old] + model_->transProb[preY][y] + emitProb;
          if (tmp > weight[now]) {
            weight[now] = tmp;
            path[now] = preY;
          }
        }
      }
    }

    endE = weight[X-1+HMMModel::E*X];
    endS = weight[X-1+HMMModel::S*X];
    stat = 0;
    if (endE >= endS) {
      stat = HMMModel::E;
    } else {
      stat = HMMModel::S;
    }

    status.resize(X);
    for (int x = X -1 ; x >= 0; x--) {
      status[x] = stat;
      stat = path[x + stat*X];
    }
  }